

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandSymFun(Abc_Frame_t *pAbc,int argc,char **argv)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  uint *Sign;
  size_t sVar8;
  char *__s;
  uint nVars;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uint fVerbose;
  char *pcVar12;
  uint uVar13;
  ulong uVar14;
  
  fVerbose = 0;
  Extra_UtilGetoptReset();
  iVar6 = -1;
  while( true ) {
    while (iVar5 = Extra_UtilGetopt(argc,argv,"Nvh"), iVar4 = globalUtilOptind, iVar5 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar5 == -1) {
      if (iVar6 != -1) {
        if (iVar6 - 0x11U < 0xfffffff0) {
          printf("Cannot generate functions for less than 1 and more than %d variables.\n");
          return 1;
        }
        Ntk_SymFunGenerate(iVar6,fVerbose);
        return 0;
      }
      if (globalUtilOptind + 1 == argc) {
        pcVar12 = argv[globalUtilOptind];
        sVar7 = strlen(pcVar12);
        nVars = (int)sVar7 - 1;
        lVar11 = 0;
        do {
          if ((int)nVars < lVar11) {
            iVar6 = 1 << ((char)sVar7 - 7U & 0x1f);
            if ((int)nVars < 7) {
              iVar6 = 1;
            }
            Sign = (uint *)calloc((long)iVar6,8);
            sVar8 = strlen(pcVar12);
            if ((int)sVar7 != (int)sVar8) {
              __assert_fail("(int)strlen(pOnes) == nVars + 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                            ,0xdad,"word *Abc_TtSymFunGenerate(char *, int)");
            }
            bVar2 = (byte)nVars & 0x1f;
            uVar9 = 0;
            uVar10 = 0;
            if (0 < (int)nVars) {
              uVar10 = nVars;
            }
            uVar3 = 1 << bVar2;
            if (1 << bVar2 < 1) {
              uVar3 = uVar9;
            }
            for (; uVar9 != uVar3; uVar9 = uVar9 + 1) {
              uVar14 = 0;
              for (uVar13 = 0; uVar10 != uVar13; uVar13 = uVar13 + 1) {
                uVar14 = (ulong)((int)uVar14 + (uint)((uVar9 >> (uVar13 & 0x1f) & 1) != 0));
              }
              if (pcVar12[uVar14] == '1') {
                *(ulong *)(Sign + (ulong)(uVar9 >> 6) * 2) =
                     *(ulong *)(Sign + (ulong)(uVar9 >> 6) * 2) ^ 1L << ((byte)uVar9 & 0x3f);
              }
            }
            iVar6 = 2;
            if (2 < (int)nVars) {
              iVar6 = (1 << ((char)sVar7 - 3U & 0x1f)) + 1;
            }
            pcVar12 = (char *)calloc((long)iVar6,1);
            Extra_PrintHexadecimalString(pcVar12,Sign,nVars);
            free(Sign);
            if (fVerbose == 0) {
              if ((int)nVars < 9) {
                puts(pcVar12);
              }
            }
            else if ((int)nVars < 7) {
              printf("Generated truth table of the %d-variable function (%s) and set it as the current network\n"
                     ,(ulong)nVars,pcVar12);
            }
            else {
              printf("Generated truth table of the %d-variable function and set it as the current network.\n"
                     ,(ulong)nVars);
            }
            sVar7 = strlen(pcVar12);
            __s = (char *)calloc(sVar7 + 100,1);
            sprintf(__s,"read_truth %s",pcVar12);
            Cmd_CommandExecute(pAbc,__s);
            free(__s);
            free(pcVar12);
            return 0;
          }
          pbVar1 = (byte *)(pcVar12 + lVar11);
          lVar11 = lVar11 + 1;
        } while ((*pbVar1 & 0xfe) == 0x30);
        pcVar12 = "The string should be composed of zeros and ones.\n";
      }
      else {
        pcVar12 = "Not enough command-line arguments.\n";
      }
      iVar6 = -1;
      goto LAB_0023b20a;
    }
    if (iVar5 == 0x68) goto LAB_0023b17a;
    if (iVar5 != 0x4e) break;
    if (argc <= globalUtilOptind) {
      pcVar12 = "Command line switch \"-N\" should be followed by a file name.\n";
      iVar6 = -1;
LAB_0023b172:
      Abc_Print(iVar6,pcVar12);
LAB_0023b17a:
      iVar6 = -2;
      Abc_Print(-2,"usage: symfun [-N num] [-vh] <ones>\n");
      Abc_Print(-2,"\t           generated a single-output symmetric function\n");
      Abc_Print(-2,
                "\t-N <num> : prints truth tables of all N-var symmetric functions [default = not used]\n"
               );
      pcVar12 = "yes";
      if (fVerbose == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-v       : toggle verbose output [default = %s]\n",pcVar12);
      Abc_Print(-2,"\t-h       : print the command usage\n");
      Abc_Print(-2,
                "\t<ones>   : the string of N+1 zeros and ones, where N is the number of variables\n"
               );
      Abc_Print(-2,"\t           For example, to get 3-input NAND-gate, use \"symfun 1000\".\n");
      pcVar12 = "\t           To get 5-input majority gate, use \"symfun 000111\".\n";
LAB_0023b20a:
      Abc_Print(iVar6,pcVar12);
      return 1;
    }
    iVar6 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar4 + 1;
  }
  pcVar12 = "Unknown switch.\n";
  iVar6 = -2;
  goto LAB_0023b172;
}

Assistant:

int Abc_CommandSymFun( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Ntk_SymFunGenerate( int nVars, int fVerbose );
    word * pFun = NULL;
    char * pStr,  * pTruth, * pCommand;
    int c, k, nVars = -1, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Nvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by a file name.\n" );
                goto usage;
            }
            nVars = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            Abc_Print( -2, "Unknown switch.\n");
            goto usage;
        }
    }
    if ( nVars != -1 )
    {
        if ( nVars < 1 || nVars > 16 )
        {
            printf( "Cannot generate functions for less than 1 and more than %d variables.\n", nVars );
            return 1;
        }
        Ntk_SymFunGenerate( nVars, fVerbose );
        return 0;
    }
    if ( argc != globalUtilOptind + 1 )
    {
        Abc_Print( -1, "Not enough command-line arguments.\n" );
        return 1;
    }
    // make sure the string is composed of N+1 zeros and ones
    pStr = argv[globalUtilOptind];
    nVars = strlen(pStr) - 1;
    for ( k = 0; k <= nVars; k++ )
        if ( pStr[k] != '0' && pStr[k] != '1' )
            break;
    if ( k <= nVars )
    {
        Abc_Print( -1, "The string should be composed of zeros and ones.\n" );
        return 1;
    }
    // generate and print one function
    pFun = Abc_TtSymFunGenerate( pStr, nVars );
    pTruth = ABC_CALLOC( char, nVars > 2 ? (1 << (nVars-2)) + 1 : 2 );
    Extra_PrintHexadecimalString( pTruth, (unsigned *)pFun, nVars );
    ABC_FREE( pFun );
    if ( fVerbose )
    {
        if ( nVars > 6 )
            printf( "Generated truth table of the %d-variable function and set it as the current network.\n", nVars );
        else
            printf( "Generated truth table of the %d-variable function (%s) and set it as the current network\n", nVars, pTruth );
    }
    else if ( nVars <= 8 )
        printf( "%s\n", pTruth );
    // read the truth table to be the current network in ABC
    pCommand = ABC_CALLOC( char, strlen(pTruth) + 100 );
    sprintf( pCommand, "read_truth %s", pTruth );
    Cmd_CommandExecute( pAbc, pCommand );
    ABC_FREE( pCommand );
    ABC_FREE( pTruth );
    return 0;

usage:
    Abc_Print( -2, "usage: symfun [-N num] [-vh] <ones>\n" );
    Abc_Print( -2, "\t           generated a single-output symmetric function\n" );
    Abc_Print( -2, "\t-N <num> : prints truth tables of all N-var symmetric functions [default = not used]\n" );
    Abc_Print( -2, "\t-v       : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    Abc_Print( -2, "\t<ones>   : the string of N+1 zeros and ones, where N is the number of variables\n" );
    Abc_Print( -2, "\t           For example, to get 3-input NAND-gate, use \"symfun 1000\".\n" );
    Abc_Print( -2, "\t           To get 5-input majority gate, use \"symfun 000111\".\n" );

    return 1;
}